

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O3

void duckdb_fast_float::detail::decimal_right_shift(decimal *h,uint32_t shift)

{
  uint8_t *puVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t uVar6;
  uint32_t uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint32_t uVar11;
  ulong uVar12;
  uint8_t *puVar13;
  
  bVar2 = (byte)shift;
  uVar3 = h->num_digits;
  uVar9 = (ulong)uVar3;
  puVar1 = h->digits;
  uVar12 = 0;
  uVar4 = 0;
  while (uVar9 != uVar12) {
    puVar13 = h->digits + uVar12;
    uVar12 = uVar12 + 1;
    uVar4 = (ulong)*puVar13 + uVar4 * 10;
    if (uVar4 >> (bVar2 & 0x3f) != 0) goto LAB_0029314e;
  }
  if (uVar4 == 0) {
    return;
  }
  uVar5 = uVar4 >> (bVar2 & 0x3f);
  while (uVar12 = uVar9, uVar5 == 0) {
    uVar4 = uVar4 * 10;
    uVar9 = (ulong)((int)uVar9 + 1);
    uVar5 = uVar4 >> (bVar2 & 0x3f);
  }
LAB_0029314e:
  uVar10 = (uint)uVar12;
  iVar8 = (h->decimal_point - uVar10) + 1;
  h->decimal_point = iVar8;
  if (iVar8 < -0x7ff) {
    h->negative = false;
    h->truncated = false;
    h->num_digits = 0;
    h->decimal_point = 0;
    return;
  }
  uVar9 = ~(-1L << (bVar2 & 0x3f));
  uVar7 = 0;
  if (uVar10 < uVar3) {
    uVar7 = uVar3 - uVar10;
    puVar13 = puVar1;
    uVar11 = uVar7;
    do {
      uVar5 = uVar4 >> (bVar2 & 0x3f);
      uVar4 = (ulong)puVar13[uVar12 & 0xffffffff] + (uVar4 & uVar9) * 10;
      *puVar13 = (uint8_t)uVar5;
      puVar13 = puVar13 + 1;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
  }
  if (uVar4 == 0) {
    h->num_digits = uVar7;
    if (uVar7 == 0) {
      return;
    }
  }
  else {
    do {
      uVar6 = (uint8_t)(uVar4 >> (bVar2 & 0x3f));
      if (uVar7 < 0x300) {
        uVar12 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
        puVar1[uVar12] = uVar6;
      }
      else if (uVar6 != '\0') {
        h->truncated = true;
      }
      uVar4 = (uVar4 & uVar9) * 10;
    } while (uVar4 != 0);
    h->num_digits = uVar7;
  }
  uVar3 = uVar7 - 1;
  do {
    if (puVar1[uVar3] != '\0') {
      return;
    }
    h->num_digits = uVar3;
    uVar3 = uVar3 - 1;
  } while (uVar3 != 0xffffffff);
  return;
}

Assistant:

inline void decimal_right_shift(decimal &h, uint32_t shift) {
  uint32_t read_index = 0;
  uint32_t write_index = 0;

  uint64_t n = 0;

  while ((n >> shift) == 0) {
    if (read_index < h.num_digits) {
      n = (10 * n) + h.digits[read_index++];
    } else if (n == 0) {
      return;
    } else {
      while ((n >> shift) == 0) {
        n = 10 * n;
        read_index++;
      }
      break;
    }
  }
  h.decimal_point -= int32_t(read_index - 1);
  if (h.decimal_point < -decimal_point_range) { // it is zero
    h.num_digits = 0;
    h.decimal_point = 0;
    h.negative = false;
    h.truncated = false;
    return;
  }
  uint64_t mask = (uint64_t(1) << shift) - 1;
  while (read_index < h.num_digits) {
    uint8_t new_digit = uint8_t(n >> shift);
    n = (10 * (n & mask)) + h.digits[read_index++];
    h.digits[write_index++] = new_digit;
  }
  while (n > 0) {
    uint8_t new_digit = uint8_t(n >> shift);
    n = 10 * (n & mask);
    if (write_index < max_digits) {
      h.digits[write_index++] = new_digit;
    } else if (new_digit > 0) {
      h.truncated = true;
    }
  }
  h.num_digits = write_index;
  trim(h);
}